

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-math.c
# Opt level: O3

PVG_FT_Angle PVG_FT_Angle_Diff(PVG_FT_Angle angle1,PVG_FT_Angle angle2)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  
  lVar1 = -0xb3ffff;
  if (-0xb3ffff < angle2 - angle1) {
    lVar1 = angle2 - angle1;
  }
  uVar2 = (ulong)(lVar1 + angle1 != angle2);
  lVar3 = ((((lVar1 + angle1) - uVar2) - angle2) / 0x1680000 + uVar2) * 0x1680000 + angle2;
  lVar4 = lVar3 - angle1;
  lVar1 = 0xb40000;
  if (lVar4 < 0xb40000) {
    lVar1 = lVar4;
  }
  return (((lVar3 - (lVar1 + angle1)) + 0x167ffffU) / 0x1680000) * -0x1680000 + lVar4;
}

Assistant:

PVG_FT_Angle PVG_FT_Angle_Diff( PVG_FT_Angle  angle1, PVG_FT_Angle  angle2 )
{
    PVG_FT_Angle  delta = angle2 - angle1;

    while ( delta <= -PVG_FT_ANGLE_PI )
        delta += PVG_FT_ANGLE_2PI;

    while ( delta > PVG_FT_ANGLE_PI )
        delta -= PVG_FT_ANGLE_2PI;

    return delta;
}